

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

int4 __thiscall Datatype::compareDependency(Datatype *this,Datatype *op)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = op->size - this->size;
  if (uVar1 == 0) {
    if (this->metatype != op->metatype) {
      return (uint)((int)op->metatype <= (int)this->metatype) * 2 + -1;
    }
    uVar2 = this->flags & 0xfffffffe;
    uVar3 = op->flags & 0xfffffffe;
    uVar1 = -(uint)((uVar3 ^ 2) < (uVar2 ^ 2)) | 1;
    if (uVar2 == uVar3) {
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

int4 Datatype::compareDependency(const Datatype &op) const

{
  if (size != op.size) return (op.size-size);
  if (metatype != op.metatype) return (metatype < op.metatype) ? -1 : 1;
  uint4 fl = flags & (~coretype);
  uint4 opfl = op.flags & (~coretype);
  // We need to be careful here, we compare flags so that enum types are more specific than base int or uint,
  // we also want UTF16 and UTF32 to be more specific than int, BUT
  // we don't want char to be more specific than int1 because char is the default size 1 integer type.
  fl ^= chartype;
  opfl ^= chartype;
  if (fl != opfl) return (opfl < fl) ? -1 : 1;
  return 0;
}